

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

void __thiscall
Js::PolymorphicInlineCache::CopyTo
          (PolymorphicInlineCache *this,PropertyId propertyId,ScriptContext *scriptContext,
          PolymorphicInlineCache *clone)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  uint inlineCacheIndex_00;
  undefined4 *puVar4;
  Type *type_00;
  uint inlineCacheIndex;
  Type *type;
  uint i;
  PolymorphicInlineCache *clone_local;
  ScriptContext *scriptContext_local;
  PropertyId propertyId_local;
  PolymorphicInlineCache *this_local;
  
  if (clone == (PolymorphicInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x36d,"(clone)","clone");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  clone->ignoreForEquivalentObjTypeSpec = (Type)(this->ignoreForEquivalentObjTypeSpec & 1);
  clone->cloneForJitTimeUse = (Type)(this->cloneForJitTimeUse & 1);
  for (type._4_4_ = 0; uVar3 = GetSize(this), type._4_4_ < uVar3; type._4_4_ = type._4_4_ + 1) {
    type_00 = InlineCache::GetType(this->inlineCaches + type._4_4_);
    if (type_00 != (Type *)0x0) {
      inlineCacheIndex_00 = GetInlineCacheIndexForType(clone,type_00);
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,CloneCacheInCollisionPhase);
      if ((((!bVar2) &&
           (bVar2 = InlineCache::IsEmpty(clone->inlineCaches + inlineCacheIndex_00), !bVar2)) &&
          (bVar2 = InlineCache::NeedsToBeRegisteredForStoreFieldInvalidation
                             (clone->inlineCaches + inlineCacheIndex_00), !bVar2)) &&
         (uVar3 = GetSize(this), uVar3 != 1)) {
        bVar2 = InlineCache::IsLocal(clone->inlineCaches + inlineCacheIndex_00);
        if (bVar2) {
          CloneInlineCacheToEmptySlotInCollision<true,false,false>
                    (clone,type_00,inlineCacheIndex_00);
        }
        else {
          bVar2 = InlineCache::IsProto(clone->inlineCaches + inlineCacheIndex_00);
          if (bVar2) {
            CloneInlineCacheToEmptySlotInCollision<false,true,false>
                      (clone,type_00,inlineCacheIndex_00);
          }
          else {
            CloneInlineCacheToEmptySlotInCollision<false,false,true>
                      (clone,type_00,inlineCacheIndex_00);
          }
        }
      }
      InlineCache::CopyTo(this->inlineCaches + type._4_4_,propertyId,scriptContext,
                          clone->inlineCaches + inlineCacheIndex_00);
      UpdateInlineCachesFillInfo(clone,inlineCacheIndex_00,true);
    }
  }
  return;
}

Assistant:

void PolymorphicInlineCache::CopyTo(PropertyId propertyId, ScriptContext* scriptContext, PolymorphicInlineCache *const clone)
    {
        Assert(clone);

        clone->ignoreForEquivalentObjTypeSpec = this->ignoreForEquivalentObjTypeSpec;
        clone->cloneForJitTimeUse = this->cloneForJitTimeUse;

        for (uint i = 0; i < GetSize(); ++i)
        {
            Type * type = inlineCaches[i].GetType();
            if (type)
            {
                uint inlineCacheIndex = clone->GetInlineCacheIndexForType(type);

                // When copying inline caches from one polymorphic cache to another, types are again hashed to get the corresponding indices in the new polymorphic cache.
                // This might lead to collision in the new cache. We need to try to resolve that collision.
                if (!PHASE_OFF1(Js::CloneCacheInCollisionPhase))
                {
                    if (!clone->inlineCaches[inlineCacheIndex].IsEmpty() && !clone->inlineCaches[inlineCacheIndex].NeedsToBeRegisteredForStoreFieldInvalidation() && GetSize() != 1)
                    {
                        if (clone->inlineCaches[inlineCacheIndex].IsLocal())
                        {
                            clone->CloneInlineCacheToEmptySlotInCollision<true, false, false>(type, inlineCacheIndex);
                        }
                        else if (clone->inlineCaches[inlineCacheIndex].IsProto())
                        {
                            clone->CloneInlineCacheToEmptySlotInCollision<false, true, false>(type, inlineCacheIndex);
                        }
                        else
                        {
                            clone->CloneInlineCacheToEmptySlotInCollision<false, false, true>(type, inlineCacheIndex);
                        }

                    }
                }
                inlineCaches[i].CopyTo(propertyId, scriptContext, &clone->inlineCaches[inlineCacheIndex]);
                clone->UpdateInlineCachesFillInfo(inlineCacheIndex, true /*set*/);
            }
        }
    }